

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O3

void do_flip_h_no_crop(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
                      jvirt_barray_ptr *src_coef_arrays)

{
  JCOEF JVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  jpeg_component_info *pjVar5;
  JBLOCKROW paJVar6;
  JBLOCKARRAY ppaJVar7;
  int iVar8;
  JDIMENSION JVar9;
  long lVar10;
  JCOEF *pJVar11;
  long lVar12;
  JCOEF *pJVar13;
  uint uVar14;
  long lVar15;
  JDIMENSION JVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  
  uVar3 = srcinfo->output_width;
  iVar8 = dstinfo->num_components;
  iVar4 = dstinfo->max_h_samp_factor;
  if (0 < iVar8) {
    lVar15 = 0;
    do {
      pjVar5 = dstinfo->comp_info;
      if (pjVar5[lVar15].height_in_blocks != 0) {
        uVar17 = pjVar5[lVar15].h_samp_factor * (uVar3 / (uint)(iVar4 << 3));
        uVar19 = pjVar5[lVar15].h_samp_factor * x_crop_offset;
        JVar9 = pjVar5[lVar15].v_samp_factor;
        JVar16 = 0;
        do {
          ppaJVar7 = (*srcinfo->mem->access_virt_barray)
                               ((j_common_ptr)srcinfo,src_coef_arrays[lVar15],JVar16,JVar9,1);
          JVar9 = pjVar5[lVar15].v_samp_factor;
          if (0 < (int)JVar9) {
            lVar18 = 0;
            do {
              if (uVar17 != 0) {
                paJVar6 = ppaJVar7[lVar18];
                lVar10 = 0;
                do {
                  pJVar11 = paJVar6[lVar10];
                  pJVar13 = paJVar6[~(uint)lVar10 + uVar17];
                  uVar14 = 0xfffffffe;
                  do {
                    JVar1 = *pJVar11;
                    *pJVar11 = *pJVar13;
                    *pJVar13 = JVar1;
                    sVar2 = pJVar11[1];
                    pJVar11[1] = -pJVar13[1];
                    pJVar13[1] = -sVar2;
                    uVar14 = uVar14 + 2;
                    pJVar11 = pJVar11 + 2;
                    pJVar13 = pJVar13 + 2;
                  } while (uVar14 < 0x3e);
                  lVar12 = lVar10 * 2;
                  lVar10 = lVar10 + 1;
                } while (lVar12 + 2U < (ulong)uVar17);
              }
              if ((uVar19 != 0) && (pjVar5[lVar15].width_in_blocks != 0)) {
                lVar10 = 0;
                uVar20 = 0;
                do {
                  lVar12 = (long)*ppaJVar7[lVar18] + lVar10;
                  jcopy_block_row(lVar12 + (ulong)uVar19 * 0x80,lVar12,1);
                  uVar20 = uVar20 + 1;
                  lVar10 = lVar10 + 0x80;
                } while (uVar20 < pjVar5[lVar15].width_in_blocks);
                JVar9 = pjVar5[lVar15].v_samp_factor;
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < (int)JVar9);
          }
          JVar16 = JVar16 + JVar9;
        } while (JVar16 < pjVar5[lVar15].height_in_blocks);
        iVar8 = dstinfo->num_components;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar8);
  }
  return;
}

Assistant:

LOCAL(void)
do_flip_h_no_crop(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                  JDIMENSION x_crop_offset, jvirt_barray_ptr *src_coef_arrays)
/* Horizontal flip; done in-place, so no separate dest array is required.
 * NB: this only works when y_crop_offset is zero.
 */
{
  JDIMENSION MCU_cols, comp_width, blk_x, blk_y, x_crop_blocks;
  int ci, k, offset_y;
  JBLOCKARRAY buffer;
  JCOEFPTR ptr1, ptr2;
  JCOEF temp1, temp2;
  jpeg_component_info *compptr;

  /* Horizontal mirroring of DCT blocks is accomplished by swapping
   * pairs of blocks in-place.  Within a DCT block, we perform horizontal
   * mirroring by changing the signs of odd-numbered columns.
   * Partial iMCUs at the right edge are left untouched.
   */
  MCU_cols = srcinfo->output_width /
             (dstinfo->max_h_samp_factor * dstinfo_min_DCT_h_scaled_size);

  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    comp_width = MCU_cols * compptr->h_samp_factor;
    x_crop_blocks = x_crop_offset * compptr->h_samp_factor;
    for (blk_y = 0; blk_y < compptr->height_in_blocks;
         blk_y += compptr->v_samp_factor) {
      buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, src_coef_arrays[ci], blk_y,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        /* Do the mirroring */
        for (blk_x = 0; blk_x * 2 < comp_width; blk_x++) {
          ptr1 = buffer[offset_y][blk_x];
          ptr2 = buffer[offset_y][comp_width - blk_x - 1];
          /* this unrolled loop doesn't need to know which row it's on... */
          for (k = 0; k < DCTSIZE2; k += 2) {
            temp1 = *ptr1;      /* swap even column */
            temp2 = *ptr2;
            *ptr1++ = temp2;
            *ptr2++ = temp1;
            temp1 = *ptr1;      /* swap odd column with sign change */
            temp2 = *ptr2;
            *ptr1++ = -temp2;
            *ptr2++ = -temp1;
          }
        }
        if (x_crop_blocks > 0) {
          /* Now left-justify the portion of the data to be kept.
           * We can't use a single jcopy_block_row() call because that routine
           * depends on memcpy(), whose behavior is unspecified for overlapping
           * source and destination areas.  Sigh.
           */
          for (blk_x = 0; blk_x < compptr->width_in_blocks; blk_x++) {
            jcopy_block_row(buffer[offset_y] + blk_x + x_crop_blocks,
                            buffer[offset_y] + blk_x, (JDIMENSION)1);
          }
        }
      }
    }
  }
}